

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoSimulateBack(Gia_IsoMan_t *p,int Iter)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int fCompl;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  int iObj;
  int i;
  Gia_Obj_t *pObjF;
  Gia_Obj_t *pObj;
  int Iter_local;
  Gia_IsoMan_t *p_local;
  
  local_2c = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->pGia->vCos);
    bVar6 = false;
    if (local_2c < iVar3) {
      pObjF = Gia_ManCo(p->pGia,local_2c);
      bVar6 = pObjF != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjId(p->pGia,pObjF);
    uVar1 = pObjF->Value;
    fCompl = Gia_ObjFaninC0(pObjF);
    uVar4 = Gia_IsoUpdate(p,Iter,iVar3,fCompl);
    pGVar5 = Gia_ObjFanin0(pObjF);
    pGVar5->Value = uVar1 + uVar4 + pGVar5->Value;
    local_2c = local_2c + 1;
  }
  local_2c = p->pGia->nObjs;
  while( true ) {
    local_2c = local_2c + -1;
    bVar6 = false;
    if (0 < local_2c) {
      pObjF = Gia_ManObj(p->pGia,local_2c);
      bVar6 = pObjF != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjIsAnd(pObjF);
    if (iVar3 != 0) {
      uVar1 = pObjF->Value;
      iVar3 = Gia_ObjFaninC0(pObjF);
      uVar4 = Gia_IsoUpdate(p,Iter,local_2c,iVar3);
      pGVar5 = Gia_ObjFanin0(pObjF);
      pGVar5->Value = uVar1 + uVar4 + pGVar5->Value;
      uVar1 = pObjF->Value;
      iVar3 = Gia_ObjFaninC1(pObjF);
      uVar4 = Gia_IsoUpdate(p,Iter,local_2c,iVar3);
      pGVar5 = Gia_ObjFanin1(pObjF);
      pGVar5->Value = uVar1 + uVar4 + pGVar5->Value;
    }
  }
  local_2c = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p->pGia);
    bVar6 = false;
    if (local_2c < iVar3) {
      pGVar2 = p->pGia;
      iVar3 = Gia_ManPoNum(p->pGia);
      _iObj = Gia_ManCo(pGVar2,iVar3 + local_2c);
      bVar6 = false;
      if (_iObj != (Gia_Obj_t *)0x0) {
        pGVar2 = p->pGia;
        iVar3 = Gia_ManPiNum(p->pGia);
        pObjF = Gia_ManCi(pGVar2,iVar3 + local_2c);
        bVar6 = pObjF != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar6) break;
    _iObj->Value = pObjF->Value + _iObj->Value;
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Gia_IsoSimulateBack( Gia_IsoMan_t * p, int Iter )
{
    Gia_Obj_t * pObj, * pObjF;
    int i, iObj;
    // simulate COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        Gia_ObjFanin0(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, iObj, Gia_ObjFaninC0(pObj));
    }
    // simulate objects
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        Gia_ObjFanin0(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, i, Gia_ObjFaninC0(pObj));
        Gia_ObjFanin1(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, i, Gia_ObjFaninC1(pObj));
    }
    // transfer flop values
    Gia_ManForEachRiRo( p->pGia, pObjF, pObj, i )
        pObjF->Value += pObj->Value;
}